

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint *puVar2;
  RefCntBuffer *pRVar3;
  aom_transfer_characteristics_t aVar4;
  aom_color_range_t aVar5;
  int iVar6;
  aom_codec_err_t aVar7;
  uint uVar8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  
  aVar7 = AOM_CODEC_INCAPABLE;
  if ((ctx->ppi->cpi->oxcf).algo_cfg.skip_postproc_filtering == false) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar9 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar9 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar9 + 1;
    }
    puVar2 = (uint *)*puVar9;
    if (puVar2 == (uint *)0x0) {
      aVar7 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      aVar7 = AOM_CODEC_ERROR;
      if (((ulong)*puVar2 < 8) &&
         (pRVar3 = (ctx->ppi->cpi->common).ref_frame_map[*puVar2], pRVar3 != (RefCntBuffer *)0x0)) {
        uVar1 = (pRVar3->buf).subsampling_y;
        if (uVar1 == 0) {
          uVar11 = (pRVar3->buf).subsampling_x;
          if (uVar11 == 0) {
            puVar2[2] = 0x106;
            uVar8 = 0x18;
            uVar11 = 0;
            uVar10 = 0x906;
          }
          else {
            puVar2[2] = 0x105;
            uVar8 = 0x10;
            uVar10 = 0x905;
          }
        }
        else {
          puVar2[2] = 0x102;
          uVar11 = (pRVar3->buf).subsampling_x;
          uVar8 = 0xc;
          uVar10 = 0x902;
        }
        aVar4 = (pRVar3->buf).transfer_characteristics;
        puVar2[3] = (pRVar3->buf).color_primaries;
        puVar2[4] = aVar4;
        puVar2[5] = (pRVar3->buf).matrix_coefficients;
        puVar2[6] = (uint)(pRVar3->buf).monochrome;
        aVar5 = (pRVar3->buf).color_range;
        puVar2[7] = (pRVar3->buf).chroma_sample_position;
        puVar2[8] = aVar5;
        puVar2[0xb] = 8;
        puVar2[9] = (pRVar3->buf).field_0.field_0.y_width;
        puVar2[10] = (pRVar3->buf).field_1.field_0.y_height;
        puVar2[0xc] = (pRVar3->buf).field_2.field_0.y_crop_width;
        puVar2[0xd] = (pRVar3->buf).field_3.field_0.y_crop_height;
        iVar6 = (pRVar3->buf).render_height;
        puVar2[0xe] = (pRVar3->buf).render_width;
        puVar2[0xf] = iVar6;
        puVar2[0x10] = uVar11;
        puVar2[0x11] = uVar1;
        *(uint8_t **)(puVar2 + 0x12) = (pRVar3->buf).field_5.field_0.y_buffer;
        *(uint8_t **)(puVar2 + 0x14) = (pRVar3->buf).field_5.field_0.u_buffer;
        *(uint8_t **)(puVar2 + 0x16) = (pRVar3->buf).field_5.field_0.v_buffer;
        puVar2[0x18] = (pRVar3->buf).field_4.field_0.y_stride;
        uVar1 = (pRVar3->buf).field_4.field_0.uv_stride;
        puVar2[0x19] = uVar1;
        puVar2[0x1a] = uVar1;
        if (((pRVar3->buf).flags & 8) != 0) {
          uVar8 = uVar8 * 2;
          puVar2[2] = uVar10;
          puVar2[0xb] = (pRVar3->buf).bit_depth;
          *(long *)(puVar2 + 0x12) = (long)(pRVar3->buf).field_5.field_0.y_buffer * 2;
          *(long *)(puVar2 + 0x14) = (long)(pRVar3->buf).field_5.field_0.u_buffer * 2;
          *(long *)(puVar2 + 0x16) = (long)(pRVar3->buf).field_5.field_0.v_buffer * 2;
          puVar2[0x18] = (pRVar3->buf).field_4.field_0.y_stride * 2;
          puVar2[0x19] = (pRVar3->buf).field_4.field_0.uv_stride * 2;
          puVar2[0x1a] = (pRVar3->buf).field_4.field_0.uv_stride * 2;
        }
        puVar2[0x1e] = uVar8;
        puVar2[0x22] = 0;
        puVar2[0x23] = 0;
        *(uint8_t **)(puVar2 + 0x24) = (pRVar3->buf).buffer_alloc;
        puVar2[0x26] = 0;
        puVar2[0x27] = 0;
        *(size_t *)(puVar2 + 0x1c) = (pRVar3->buf).frame_size;
        puVar2[0x28] = 0;
        puVar2[0x29] = 0;
        return AOM_CODEC_OK;
      }
    }
  }
  return aVar7;
}

Assistant:

static aom_codec_err_t ctrl_get_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  if (ctx->ppi->cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return AOM_CODEC_INCAPABLE;
  av1_ref_frame_t *const frame = va_arg(args, av1_ref_frame_t *);

  if (frame != NULL) {
    YV12_BUFFER_CONFIG *fb = get_ref_frame(&ctx->ppi->cpi->common, frame->idx);
    if (fb == NULL) return AOM_CODEC_ERROR;

    yuvconfig2image(&frame->img, fb, NULL);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}